

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O1

void __thiscall Zippy::ZipArchive::Save(ZipArchive *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer pZVar3;
  pointer pBuf;
  long lVar4;
  ZipArchive *this_00;
  mz_zip_internal_state *pmVar5;
  string *fileName;
  mz_bool mVar6;
  int iVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  FILE *pFVar10;
  size_t sVar11;
  runtime_error *prVar12;
  char *pcVar13;
  logic_error *this_01;
  size_type __n;
  int length;
  byte bVar14;
  pointer pZVar15;
  undefined4 uVar16;
  ulong uVar17;
  bool bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  string tempPath;
  allocator<char> local_141;
  ZipArchive *local_140;
  undefined1 local_138 [32];
  mz_uint64 mStack_118;
  mz_alloc_func p_Stack_110;
  mz_free_func p_Stack_108;
  code *pcStack_100;
  void *pvStack_f8;
  mz_file_read_func p_Stack_f0;
  mz_file_write_func p_Stack_e8;
  mz_file_needs_keepalive p_Stack_e0;
  string *psStack_d8;
  mz_zip_internal_state *pmStack_d0;
  undefined1 local_c8 [28];
  undefined4 uStack_ac;
  mz_uint64 mStack_a8;
  mz_alloc_func p_Stack_a0;
  mz_free_func p_Stack_98;
  mz_realloc_func p_Stack_90;
  void *pvStack_88;
  mz_file_read_func p_Stack_80;
  mz_file_write_func p_Stack_78;
  mz_file_needs_keepalive p_Stack_70;
  void *pvStack_68;
  mz_zip_internal_state *pmStack_60;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  string *local_38;
  
  if (this->m_IsOpen == false) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c8,"Cannot call Save on empty ZipArchive object!","");
    std::logic_error::logic_error(this_01,(string *)local_c8);
    *(undefined ***)this_01 = &PTR__logic_error_00180de8;
    __cxa_throw(this_01,&ZipLogicError::typeinfo,std::logic_error::~logic_error);
  }
  if (filename->_M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (filename,&this->m_ArchivePath);
  }
  if (filename->_M_string_length == 0) {
LAB_00132f16:
    __n = 0;
  }
  else {
    sVar8 = filename->_M_string_length + 1;
    do {
      if (sVar8 == 1) goto LAB_00132f16;
      __n = sVar8 - 1;
      lVar4 = sVar8 - 2;
      sVar8 = __n;
    } while ((filename->_M_dataplus)._M_p[lVar4] != '/');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,filename,
             0,__n);
  Impl::GenerateRandomName_abi_cxx11_((string *)local_138,(Impl *)0x14,length);
  uVar17 = 0xf;
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    uVar17 = local_c8._16_8_;
  }
  if (uVar17 < (ulong)(local_138._8_8_ + local_c8._8_8_)) {
    uVar17 = 0xf;
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      uVar17 = CONCAT44(local_138._20_4_,local_138._16_4_);
    }
    if (uVar17 < (ulong)(local_138._8_8_ + local_c8._8_8_)) goto LAB_00132f86;
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     0,0,(char *)local_c8._0_8_,local_c8._8_8_);
  }
  else {
LAB_00132f86:
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,(char *)local_138._0_8_,local_138._8_8_);
  }
  local_58 = &local_48;
  psVar2 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar1 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar1) {
    local_48 = paVar1->_M_allocated_capacity;
    uStack_40 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_48 = paVar1->_M_allocated_capacity;
    local_58 = psVar2;
  }
  local_50 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar9->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_,CONCAT44(local_138._20_4_,local_138._16_4_) + 1);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  psVar2 = local_58;
  pvStack_f8 = (void *)0x0;
  p_Stack_f0 = (mz_file_read_func)0x0;
  pmStack_d0 = (mz_zip_internal_state *)0x0;
  local_138._20_4_ = 0;
  local_138._24_4_ = 0;
  local_138._28_4_ = 0;
  mStack_118 = 0;
  p_Stack_e8 = mz_zip_file_write_func;
  p_Stack_e0 = (mz_file_needs_keepalive)0x0;
  p_Stack_110 = miniz_def_alloc_func;
  p_Stack_108 = miniz_def_free_func;
  pcStack_100 = miniz_def_realloc_func;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = 0;
  local_138._16_4_ = 0;
  psStack_d8 = (string *)local_138;
  local_38 = filename;
  pmStack_d0 = (mz_zip_internal_state *)miniz_def_alloc_func((void *)0x0,1,0x98);
  if (pmStack_d0 == (mz_zip_internal_state *)0x0) {
    local_138._28_4_ = 0x10;
  }
  else {
    auVar20 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar19 = auVar20._0_32_;
    auVar21 = auVar20._32_32_;
    (pmStack_d0->m_central_dir).m_p = (void *)auVar19._0_8_;
    (pmStack_d0->m_central_dir).m_size = auVar19._8_8_;
    (pmStack_d0->m_central_dir).m_capacity = auVar19._16_8_;
    (pmStack_d0->m_central_dir).m_element_size = auVar19._24_4_;
    *(int *)&(pmStack_d0->m_central_dir).field_0x1c = auVar19._28_4_;
    (pmStack_d0->m_central_dir_offsets).m_p = (void *)auVar21._0_8_;
    (pmStack_d0->m_central_dir_offsets).m_size = auVar21._8_8_;
    (pmStack_d0->m_central_dir_offsets).m_capacity = auVar21._16_8_;
    (pmStack_d0->m_central_dir_offsets).m_element_size = auVar21._24_4_;
    *(int *)&(pmStack_d0->m_central_dir_offsets).field_0x1c = auVar21._28_4_;
    *(undefined1 (*) [64])&(pmStack_d0->m_sorted_central_dir_offsets).m_element_size = auVar20;
    auVar19 = auVar20._0_32_;
    (pmStack_d0->m_sorted_central_dir_offsets).m_p = (void *)auVar19._0_8_;
    (pmStack_d0->m_sorted_central_dir_offsets).m_size = auVar19._8_8_;
    (pmStack_d0->m_sorted_central_dir_offsets).m_capacity = auVar19._16_8_;
    (pmStack_d0->m_sorted_central_dir_offsets).m_element_size = auVar19._24_4_;
    *(int *)&(pmStack_d0->m_sorted_central_dir_offsets).field_0x1c = auVar19._28_4_;
    pmStack_d0->m_init_flags = auVar20._32_4_;
    pmStack_d0->m_zip64 = auVar20._36_4_;
    pmStack_d0->m_zip64_has_extended_info_fields = auVar20._40_4_;
    *(int *)&pmStack_d0->field_0x6c = auVar20._44_4_;
    pmStack_d0->m_pFile = (FILE *)auVar20._48_8_;
    pmStack_d0->m_file_archive_start_ofs = auVar20._56_8_;
    (pmStack_d0->m_central_dir).m_element_size = 1;
    (pmStack_d0->m_central_dir_offsets).m_element_size = 4;
    (pmStack_d0->m_sorted_central_dir_offsets).m_element_size = 4;
    pmStack_d0->m_zip64 = 0;
    pmStack_d0->m_zip64_has_extended_info_fields = 0;
    local_138._20_4_ = 2;
    local_138._24_4_ = 1;
    pFVar10 = fopen64((char *)psVar2,"wb");
    if (pFVar10 == (FILE *)0x0) {
      mz_zip_writer_end((mz_zip_archive *)local_138);
      local_138._28_4_ = 0x11;
    }
    else {
      pmStack_d0->m_pFile = (FILE *)pFVar10;
      local_138._24_4_ = 4;
    }
  }
  pZVar15 = (this->m_ZipEntries).
            super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pZVar3 = (this->m_ZipEntries).
           super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_140 = this;
  if (pZVar15 != pZVar3) {
    do {
      if ((pZVar15->m_EntryInfo).m_is_directory == 0) {
        if (pZVar15->m_IsModified == false) {
          mVar6 = mz_zip_writer_add_from_zip_reader
                            ((mz_zip_archive *)local_138,&this->m_Archive,
                             (pZVar15->m_EntryInfo).m_file_index);
          if (mVar6 == 0) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            pcVar13 = mz_zip_get_error_string((local_140->m_Archive).m_last_error);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_c8,pcVar13,&local_141);
            std::runtime_error::runtime_error(prVar12,(string *)local_c8);
            *(undefined ***)prVar12 = &PTR__runtime_error_00180d78;
            __cxa_throw(prVar12,&ZipRuntimeError::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          pcVar13 = (pZVar15->m_EntryInfo).m_filename;
          local_c8._0_8_ = local_c8 + 0x10;
          sVar11 = strlen(pcVar13);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,pcVar13,(pZVar15->m_EntryInfo).m_filename + sVar11);
          pBuf = (pZVar15->m_EntryData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
          mVar6 = mz_zip_writer_add_mem_ex_v2
                            ((mz_zip_archive *)local_138,(char *)local_c8._0_8_,pBuf,
                             (long)(pZVar15->m_EntryData).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBuf,
                             (void *)0x0,0,0xffffffff,0,0,(time_t *)0x0,(char *)0x0,0,(char *)0x0,0)
          ;
          if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
            operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          }
          if (mVar6 == 0) {
            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
            pcVar13 = mz_zip_get_error_string((local_140->m_Archive).m_last_error);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_c8,pcVar13,&local_141);
            std::runtime_error::runtime_error(prVar12,(string *)local_c8);
            *(undefined ***)prVar12 = &PTR__runtime_error_00180d78;
            __cxa_throw(prVar12,&ZipRuntimeError::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      pZVar15 = pZVar15 + 1;
    } while (pZVar15 != pZVar3);
  }
  mz_zip_writer_finalize_archive((mz_zip_archive *)local_138);
  pmVar5 = pmStack_d0;
  this_00 = local_140;
  if ((((pmStack_d0 == (mz_zip_internal_state *)0x0) || (p_Stack_110 == (mz_alloc_func)0x0)) ||
      (p_Stack_108 == (mz_free_func)0x0)) || ((local_138._20_4_ & 0xfffffffe) != 2)) {
    local_138._28_4_ = 0x18;
  }
  else {
    pmStack_d0 = (mz_zip_internal_state *)0x0;
    (*p_Stack_108)(pvStack_f8,(pmVar5->m_central_dir).m_p);
    (pmVar5->m_central_dir).m_p = (void *)0x0;
    (pmVar5->m_central_dir).m_size = 0;
    (pmVar5->m_central_dir).m_capacity = 0;
    *(undefined8 *)&(pmVar5->m_central_dir).m_element_size = 0;
    (*p_Stack_108)(pvStack_f8,(pmVar5->m_central_dir_offsets).m_p);
    (pmVar5->m_central_dir_offsets).m_p = (void *)0x0;
    (pmVar5->m_central_dir_offsets).m_size = 0;
    (pmVar5->m_central_dir_offsets).m_capacity = 0;
    *(undefined8 *)&(pmVar5->m_central_dir_offsets).m_element_size = 0;
    (*p_Stack_108)(pvStack_f8,(pmVar5->m_sorted_central_dir_offsets).m_p);
    (pmVar5->m_sorted_central_dir_offsets).m_p = (void *)0x0;
    (pmVar5->m_sorted_central_dir_offsets).m_size = 0;
    (pmVar5->m_sorted_central_dir_offsets).m_capacity = 0;
    *(undefined8 *)&(pmVar5->m_sorted_central_dir_offsets).m_element_size = 0;
    if ((FILE *)pmVar5->m_pFile != (FILE *)0x0) {
      if ((local_138._24_4_ == 4) && (iVar7 = fclose((FILE *)pmVar5->m_pFile), iVar7 == -1)) {
        local_138._28_4_ = 0x15;
      }
      pmVar5->m_pFile = (FILE *)0x0;
    }
    if ((p_Stack_e8 == mz_zip_heap_write_func) && (pmVar5->m_pMem != (void *)0x0)) {
      (*p_Stack_108)(pvStack_f8,pmVar5->m_pMem);
      pmVar5->m_pMem = (void *)0x0;
    }
    (*p_Stack_108)(pvStack_f8,pmVar5);
    local_138._20_4_ = 0;
  }
  bVar14 = 1;
  if (local_58 == (size_type *)0x0) {
    uVar16 = MZ_ZIP_INVALID_PARAMETER;
    goto LAB_00133568;
  }
  pvStack_88 = (void *)0x0;
  p_Stack_80 = (mz_file_read_func)0x0;
  p_Stack_78 = (mz_file_write_func)0x0;
  p_Stack_70 = (mz_file_needs_keepalive)0x0;
  pvStack_68 = (void *)0x0;
  pmStack_60 = (mz_zip_internal_state *)0x0;
  local_c8._0_8_ = (char *)0x0;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  stack0xffffffffffffff50 = 0;
  mStack_a8 = 0;
  p_Stack_a0 = (mz_alloc_func)0x0;
  p_Stack_98 = (mz_free_func)0x0;
  p_Stack_90 = (mz_realloc_func)0x0;
  mVar6 = mz_zip_reader_init_file_v2((mz_zip_archive *)local_c8,(char *)local_58,0,0,0);
  if (mVar6 == 0) {
    uVar16 = uStack_ac;
    goto LAB_00133568;
  }
  uVar16 = 0x18;
  if ((((pmStack_60 == (mz_zip_internal_state *)0x0) || (p_Stack_a0 == (mz_alloc_func)0x0)) ||
      (p_Stack_98 == (mz_free_func)0x0)) || (p_Stack_80 == (mz_file_read_func)0x0)) {
LAB_00133529:
    uStack_ac = uVar16;
    bVar18 = false;
  }
  else {
    uVar16 = 0x1d;
    if (pmStack_60->m_zip64 == 0) {
      if ((0xffff < (uint)local_c8._16_4_) || ((ulong)local_c8._0_8_ >> 0x20 != 0))
      goto LAB_00133529;
    }
    else if ((local_c8._16_4_ == 0xffffffff) || (0xfffffffe < (pmStack_60->m_central_dir).m_size))
    goto LAB_00133529;
    if (local_c8._16_4_ == 0) {
      bVar18 = true;
    }
    else {
      uVar17 = 0;
      do {
        mVar6 = mz_zip_validate_file((mz_zip_archive *)local_c8,(mz_uint)uVar17,0);
        bVar18 = mVar6 != 0;
        if (mVar6 == 0) break;
        uVar17 = uVar17 + 1;
      } while (uVar17 < (local_c8._16_8_ & 0xffffffff));
    }
  }
  uVar16 = uStack_ac;
  mVar6 = mz_zip_reader_end_internal((mz_zip_archive *)local_c8,(uint)bVar18);
  if (bVar18 != false) {
    uVar16 = MZ_ZIP_NO_ERROR;
  }
  if (uVar16 == MZ_ZIP_NO_ERROR && mVar6 == 0) {
    uVar16 = uStack_ac;
  }
  bVar14 = mVar6 == 0 | bVar18 ^ 1U;
LAB_00133568:
  if (bVar14 == 0) {
    Close(this_00);
    fileName = local_38;
    remove((local_38->_M_dataplus)._M_p);
    rename((char *)local_58,(fileName->_M_dataplus)._M_p);
    Open(this_00,fileName);
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    return;
  }
  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar13 = mz_zip_get_error_string(uVar16);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,pcVar13,&local_141);
  std::runtime_error::runtime_error(prVar12,(string *)local_c8);
  *(undefined ***)prVar12 = &PTR__runtime_error_00180d78;
  __cxa_throw(prVar12,&ZipRuntimeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Save(std::string filename = "") {

            if (!IsOpen()) throw ZipLogicError("Cannot call Save on empty ZipArchive object!");

            if (filename.empty())
                filename = m_ArchivePath;

            // ===== Generate a random file name with the same path as the current file
            std::string tempPath = filename.substr(0, filename.rfind('/') + 1) + Impl::GenerateRandomName(20);

            // ===== Prepare an temporary archive file with the random filename;
            mz_zip_archive tempArchive = mz_zip_archive();
            mz_zip_writer_init_file(&tempArchive, tempPath.c_str(), 0);

            // ===== Iterate through the ZipEntries and add entries to the temporary file
            for (auto& file : m_ZipEntries) {
                if (file.IsDirectory()) continue; //TODO: Ensure this is the right thing to do (Excel issue)
                if (!file.IsModified()) {
                    if (!mz_zip_writer_add_from_zip_reader(&tempArchive, &m_Archive, file.Index()))
                        throw ZipRuntimeError(mz_zip_get_error_string(m_Archive.m_last_error));
                }

                else {
                    if (!mz_zip_writer_add_mem(&tempArchive,
                                               file.GetName().c_str(),
                                               file.m_EntryData.data(),
                                               file.m_EntryData.size(),
                                               MZ_DEFAULT_COMPRESSION))
                        throw ZipRuntimeError(mz_zip_get_error_string(m_Archive.m_last_error));
                }

            }

            // ===== Finalize and close the temporary archive
            mz_zip_writer_finalize_archive(&tempArchive);
            mz_zip_writer_end(&tempArchive);

            // ===== Validate the temporary file
            mz_zip_error errordata;
            if (!mz_zip_validate_file_archive(tempPath.c_str(), 0, &errordata))
                throw ZipRuntimeError(mz_zip_get_error_string(errordata));

            // ===== Close the current archive, delete the file with input filename (if it exists), rename the temporary and call Open.
            Close();
            std::remove(filename.c_str());
            std::rename(tempPath.c_str(), filename.c_str());
            Open(filename);

        }